

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow_p.h
# Opt level: O3

void __thiscall
QMdi::ControlElement<QMdi::ControllerWidget>::ControlElement
          (ControlElement<QMdi::ControllerWidget> *this,QMdiSubWindow *child)

{
  Data *pDVar1;
  Data *pDVar2;
  
  ControllerWidget::ControllerWidget(&this->super_ControllerWidget,(QWidget *)0x0);
  *(undefined ***)&(this->super_ControllerWidget).super_QWidget = &PTR_metaObject_007f6938;
  *(undefined ***)&(this->super_ControllerWidget).super_QWidget.super_QPaintDevice =
       &PTR__ControlElement_007f6ae8;
  (this->mdiChild).wp.d = (Data *)0x0;
  (this->mdiChild).wp.value = (QObject *)0x0;
  if (child == (QMdiSubWindow *)0x0) {
    (this->mdiChild).wp.value = (QObject *)0x0;
  }
  else {
    pDVar2 = (Data *)QtSharedPointer::ExternalRefCountData::getAndRef((QObject *)child);
    pDVar1 = (this->mdiChild).wp.d;
    (this->mdiChild).wp.d = pDVar2;
    (this->mdiChild).wp.value = (QObject *)child;
    if (pDVar1 != (Data *)0x0) {
      LOCK();
      *(int *)pDVar1 = *(int *)pDVar1 + -1;
      UNLOCK();
      if (*(int *)pDVar1 == 0) {
        operator_delete(pDVar1);
        return;
      }
    }
  }
  return;
}

Assistant:

ControlElement(QMdiSubWindow *child) : T(nullptr)
    {
        Q_ASSERT(child);
        mdiChild = child;
    }